

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t helper_clclu(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  uint32_t uVar1;
  uint64_t unaff_retaddr;
  uint32_t cc;
  uint16_t pad;
  uint64_t src3;
  uint64_t src3len;
  uint64_t src1;
  uint64_t src1len;
  uintptr_t ra;
  uint64_t uStack_20;
  uint32_t r3_local;
  uint64_t a2_local;
  CPUS390XState_conflict *pCStack_10;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  src1len = unaff_retaddr;
  ra._4_4_ = r3;
  uStack_20 = a2;
  a2_local._4_4_ = r1;
  pCStack_10 = env;
  src1 = get_length(env,r1 + 1);
  src3len = get_address(pCStack_10,a2_local._4_4_);
  src3 = get_length(pCStack_10,ra._4_4_ + 1);
  _cc = get_address(pCStack_10,ra._4_4_);
  uVar1 = do_clcl(pCStack_10,&src3len,&src1,(uint64_t *)&cc,&src3,(uint16_t)uStack_20,0x1000,2,
                  src1len);
  set_length(pCStack_10,a2_local._4_4_ + 1,src1);
  set_length(pCStack_10,ra._4_4_ + 1,src3);
  set_address(pCStack_10,a2_local._4_4_,src3len);
  set_address(pCStack_10,ra._4_4_,_cc);
  return uVar1;
}

Assistant:

uint32_t HELPER(clclu)(CPUS390XState *env, uint32_t r1, uint64_t a2,
                       uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t src1len = get_length(env, r1 + 1);
    uint64_t src1 = get_address(env, r1);
    uint64_t src3len = get_length(env, r3 + 1);
    uint64_t src3 = get_address(env, r3);
    uint16_t pad = a2;
    uint32_t cc = 0;

    cc = do_clcl(env, &src1, &src1len, &src3, &src3len, pad, 0x1000, 2, ra);

    set_length(env, r1 + 1, src1len);
    set_length(env, r3 + 1, src3len);
    set_address(env, r1, src1);
    set_address(env, r3, src3);

    return cc;
}